

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

int ImGui::FindWindowFocusIndex(ImGuiWindow *window)

{
  ImGuiWindow **ppIVar1;
  int i;
  ImVector<ImGuiWindow_*> *this;
  
  i = (GImGui->WindowsFocusOrder).Size;
  this = &GImGui->WindowsFocusOrder;
  do {
    if (i < 1) {
      return -1;
    }
    i = i + -1;
    ppIVar1 = ImVector<ImGuiWindow_*>::operator[](this,i);
  } while (*ppIVar1 != window);
  return i;
}

Assistant:

static int ImGui::FindWindowFocusIndex(ImGuiWindow* window) // FIXME-OPT O(N)
{
    ImGuiContext& g = *GImGui;
    for (int i = g.WindowsFocusOrder.Size-1; i >= 0; i--)
        if (g.WindowsFocusOrder[i] == window)
            return i;
    return -1;
}